

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
pbrt::BasicSceneBuilder::Option(BasicSceneBuilder *this,string *name,string *value,FileLoc loc)

{
  string_view str;
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  string *in_RDX;
  string renderCoordSys;
  string nName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee4;
  undefined1 in_stack_fffffffffffffee5;
  undefined1 in_stack_fffffffffffffee6;
  undefined1 in_stack_fffffffffffffee7;
  undefined1 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffee9;
  undefined1 in_stack_fffffffffffffeea;
  undefined1 in_stack_fffffffffffffeeb;
  undefined1 in_stack_fffffffffffffeec;
  undefined1 in_stack_fffffffffffffeed;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  ParserTarget *in_stack_fffffffffffffef0;
  undefined7 in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  undefined5 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1d;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  string *ptr;
  undefined7 in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  string local_98 [32];
  string local_78 [32];
  undefined1 local_58 [16];
  string local_38 [32];
  string *local_18;
  
  ptr = local_38;
  local_18 = in_RDX;
  normalizeArg((string *)
               CONCAT17(in_stack_ffffffffffffff1f,
                        CONCAT16(in_stack_ffffffffffffff1e,
                                 CONCAT15(in_stack_ffffffffffffff1d,in_stack_ffffffffffffff18))));
  uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffee7,
                                   CONCAT16(in_stack_fffffffffffffee6,
                                            CONCAT15(in_stack_fffffffffffffee5,
                                                     CONCAT14(in_stack_fffffffffffffee4,
                                                              in_stack_fffffffffffffee0)))),
                          (char *)in_stack_fffffffffffffed8);
  if ((bool)uVar1) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffee7,
                                     CONCAT16(in_stack_fffffffffffffee6,
                                              CONCAT15(in_stack_fffffffffffffee5,
                                                       CONCAT14(in_stack_fffffffffffffee4,
                                                                in_stack_fffffffffffffee0)))),
                            (char *)in_stack_fffffffffffffed8);
    if (bVar2) {
      *(undefined1 *)((long)Options + 5) = 1;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffee7,
                                       CONCAT16(in_stack_fffffffffffffee6,
                                                CONCAT15(in_stack_fffffffffffffee5,
                                                         CONCAT14(in_stack_fffffffffffffee4,
                                                                  in_stack_fffffffffffffee0)))),
                              (char *)in_stack_fffffffffffffed8);
      if (bVar2) {
        *(undefined1 *)((long)Options + 5) = 0;
      }
      else {
        ParserTarget::ErrorExitDeferred<std::__cxx11::string_const&>
                  (in_stack_fffffffffffffef0,
                   (FileLoc *)
                   CONCAT17(in_stack_fffffffffffffeef,
                            CONCAT16(in_stack_fffffffffffffeee,
                                     CONCAT15(in_stack_fffffffffffffeed,
                                              CONCAT14(in_stack_fffffffffffffeec,
                                                       CONCAT13(in_stack_fffffffffffffeeb,
                                                                CONCAT12(in_stack_fffffffffffffeea,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffee9,
                                                  in_stack_fffffffffffffee8))))))),
                   (char *)CONCAT17(in_stack_fffffffffffffee7,
                                    CONCAT16(in_stack_fffffffffffffee6,
                                             CONCAT15(in_stack_fffffffffffffee5,
                                                      CONCAT14(in_stack_fffffffffffffee4,
                                                               in_stack_fffffffffffffee0)))),
                   in_stack_fffffffffffffed8);
      }
    }
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffee7,
                                     CONCAT16(in_stack_fffffffffffffee6,
                                              CONCAT15(in_stack_fffffffffffffee5,
                                                       CONCAT14(in_stack_fffffffffffffee4,
                                                                in_stack_fffffffffffffee0)))),
                            (char *)in_stack_fffffffffffffed8);
    if (bVar2) {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffee7,
                                       CONCAT16(in_stack_fffffffffffffee6,
                                                CONCAT15(in_stack_fffffffffffffee5,
                                                         CONCAT14(in_stack_fffffffffffffee4,
                                                                  in_stack_fffffffffffffee0)))),
                              (char *)in_stack_fffffffffffffed8);
      if (bVar2) {
        *(undefined1 *)((long)Options + 7) = 1;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffee7,
                                          CONCAT16(in_stack_fffffffffffffee6,
                                                   CONCAT15(in_stack_fffffffffffffee5,
                                                            CONCAT14(in_stack_fffffffffffffee4,
                                                                     in_stack_fffffffffffffee0)))),
                                (char *)in_stack_fffffffffffffed8);
        if (bVar2) {
          *(undefined1 *)((long)Options + 7) = 0;
        }
        else {
          ParserTarget::ErrorExitDeferred<std::__cxx11::string_const&>
                    (in_stack_fffffffffffffef0,
                     (FileLoc *)
                     CONCAT17(in_stack_fffffffffffffeef,
                              CONCAT16(in_stack_fffffffffffffeee,
                                       CONCAT15(in_stack_fffffffffffffeed,
                                                CONCAT14(in_stack_fffffffffffffeec,
                                                         CONCAT13(in_stack_fffffffffffffeeb,
                                                                  CONCAT12(in_stack_fffffffffffffeea
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffee9,
                                                  in_stack_fffffffffffffee8))))))),
                     (char *)CONCAT17(in_stack_fffffffffffffee7,
                                      CONCAT16(in_stack_fffffffffffffee6,
                                               CONCAT15(in_stack_fffffffffffffee5,
                                                        CONCAT14(in_stack_fffffffffffffee4,
                                                                 in_stack_fffffffffffffee0)))),
                     in_stack_fffffffffffffed8);
        }
      }
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffee7,
                                       CONCAT16(in_stack_fffffffffffffee6,
                                                CONCAT15(in_stack_fffffffffffffee5,
                                                         CONCAT14(in_stack_fffffffffffffee4,
                                                                  in_stack_fffffffffffffee0)))),
                              (char *)in_stack_fffffffffffffed8);
      if (bVar2) {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffee7,
                                          CONCAT16(in_stack_fffffffffffffee6,
                                                   CONCAT15(in_stack_fffffffffffffee5,
                                                            CONCAT14(in_stack_fffffffffffffee4,
                                                                     in_stack_fffffffffffffee0)))),
                                (char *)in_stack_fffffffffffffed8);
        if (bVar2) {
          *(undefined1 *)((long)Options + 6) = 1;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffee7,
                                              CONCAT16(in_stack_fffffffffffffee6,
                                                       CONCAT15(in_stack_fffffffffffffee5,
                                                                CONCAT14(in_stack_fffffffffffffee4,
                                                                         in_stack_fffffffffffffee0))
                                                      )),(char *)in_stack_fffffffffffffed8);
          if (bVar2) {
            *(undefined1 *)((long)Options + 6) = 0;
          }
          else {
            ParserTarget::ErrorExitDeferred<std::__cxx11::string_const&>
                      (in_stack_fffffffffffffef0,
                       (FileLoc *)
                       CONCAT17(in_stack_fffffffffffffeef,
                                CONCAT16(in_stack_fffffffffffffeee,
                                         CONCAT15(in_stack_fffffffffffffeed,
                                                  CONCAT14(in_stack_fffffffffffffeec,
                                                           CONCAT13(in_stack_fffffffffffffeeb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffeea,
                                                  CONCAT11(in_stack_fffffffffffffee9,
                                                           in_stack_fffffffffffffee8))))))),
                       (char *)CONCAT17(in_stack_fffffffffffffee7,
                                        CONCAT16(in_stack_fffffffffffffee6,
                                                 CONCAT15(in_stack_fffffffffffffee5,
                                                          CONCAT14(in_stack_fffffffffffffee4,
                                                                   in_stack_fffffffffffffee0)))),
                       in_stack_fffffffffffffed8);
          }
        }
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffee7,
                                          CONCAT16(in_stack_fffffffffffffee6,
                                                   CONCAT15(in_stack_fffffffffffffee5,
                                                            CONCAT14(in_stack_fffffffffffffee4,
                                                                     in_stack_fffffffffffffee0)))),
                                (char *)in_stack_fffffffffffffed8);
        if (bVar2) {
          local_58 = std::__cxx11::string::operator_cast_to_basic_string_view(local_18);
          str._M_len._7_1_ = uVar1;
          str._M_len._0_7_ = in_stack_ffffffffffffff40;
          str._M_str = in_stack_ffffffffffffff48;
          bVar2 = Atof(str,(float *)ptr);
          if (!bVar2) {
            ParserTarget::ErrorExitDeferred<std::__cxx11::string_const&>
                      (in_stack_fffffffffffffef0,
                       (FileLoc *)
                       CONCAT17(in_stack_fffffffffffffeef,
                                CONCAT16(in_stack_fffffffffffffeee,
                                         CONCAT15(in_stack_fffffffffffffeed,
                                                  CONCAT14(in_stack_fffffffffffffeec,
                                                           CONCAT13(in_stack_fffffffffffffeeb,
                                                                    CONCAT12(
                                                  in_stack_fffffffffffffeea,
                                                  CONCAT11(in_stack_fffffffffffffee9,
                                                           in_stack_fffffffffffffee8))))))),
                       (char *)CONCAT17(in_stack_fffffffffffffee7,
                                        CONCAT16(in_stack_fffffffffffffee6,
                                                 CONCAT15(in_stack_fffffffffffffee5,
                                                          CONCAT14(in_stack_fffffffffffffee4,
                                                                   in_stack_fffffffffffffee0)))),
                       in_stack_fffffffffffffed8);
          }
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffee7,
                                              CONCAT16(in_stack_fffffffffffffee6,
                                                       CONCAT15(in_stack_fffffffffffffee5,
                                                                CONCAT14(in_stack_fffffffffffffee4,
                                                                         in_stack_fffffffffffffee0))
                                                      )),(char *)in_stack_fffffffffffffed8);
          if (bVar2) {
            uVar8 = std::__cxx11::string::size();
            if (((uVar8 < 3) || (pcVar9 = (char *)std::__cxx11::string::front(), *pcVar9 != '\"'))
               || (pcVar9 = (char *)std::__cxx11::string::back(), *pcVar9 != '\"')) {
              ParserTarget::ErrorExitDeferred<std::__cxx11::string_const&>
                        (in_stack_fffffffffffffef0,
                         (FileLoc *)
                         CONCAT17(in_stack_fffffffffffffeef,
                                  CONCAT16(in_stack_fffffffffffffeee,
                                           CONCAT15(in_stack_fffffffffffffeed,
                                                    CONCAT14(in_stack_fffffffffffffeec,
                                                             CONCAT13(in_stack_fffffffffffffeeb,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffffeea,
                                                  CONCAT11(in_stack_fffffffffffffee9,
                                                           in_stack_fffffffffffffee8))))))),
                         (char *)CONCAT17(in_stack_fffffffffffffee7,
                                          CONCAT16(in_stack_fffffffffffffee6,
                                                   CONCAT15(in_stack_fffffffffffffee5,
                                                            CONCAT14(in_stack_fffffffffffffee4,
                                                                     in_stack_fffffffffffffee0)))),
                         in_stack_fffffffffffffed8);
            }
            std::__cxx11::string::size();
            std::__cxx11::string::substr((ulong)local_78,(ulong)local_18);
            std::__cxx11::string::operator=((string *)(Options + 0x1e),local_78);
            std::__cxx11::string::~string(local_78);
          }
          else {
            uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffee7,
                                                CONCAT16(in_stack_fffffffffffffee6,
                                                         CONCAT15(in_stack_fffffffffffffee5,
                                                                  CONCAT14(in_stack_fffffffffffffee4
                                                                           ,
                                                  in_stack_fffffffffffffee0)))),
                                    (char *)in_stack_fffffffffffffed8);
            if ((bool)uVar1) {
              uVar8 = std::__cxx11::string::size();
              if (((uVar8 < 3) || (pcVar9 = (char *)std::__cxx11::string::front(), *pcVar9 != '\"'))
                 || (pcVar9 = (char *)std::__cxx11::string::back(), *pcVar9 != '\"')) {
                ParserTarget::ErrorExitDeferred<std::__cxx11::string_const&>
                          (in_stack_fffffffffffffef0,
                           (FileLoc *)
                           CONCAT17(in_stack_fffffffffffffeef,
                                    CONCAT16(in_stack_fffffffffffffeee,
                                             CONCAT15(in_stack_fffffffffffffeed,
                                                      CONCAT14(in_stack_fffffffffffffeec,
                                                               CONCAT13(in_stack_fffffffffffffeeb,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffeea,
                                                  CONCAT11(in_stack_fffffffffffffee9,
                                                           in_stack_fffffffffffffee8))))))),
                           (char *)CONCAT17(in_stack_fffffffffffffee7,
                                            CONCAT16(in_stack_fffffffffffffee6,
                                                     CONCAT15(in_stack_fffffffffffffee5,
                                                              CONCAT14(in_stack_fffffffffffffee4,
                                                                       in_stack_fffffffffffffee0))))
                           ,in_stack_fffffffffffffed8);
              }
              std::__cxx11::string::size();
              std::__cxx11::string::substr((ulong)local_98,(ulong)local_18);
              std::__cxx11::string::operator=((string *)(Options + 0x26),local_98);
              std::__cxx11::string::~string(local_98);
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffffee7,
                                                  CONCAT16(in_stack_fffffffffffffee6,
                                                           CONCAT15(in_stack_fffffffffffffee5,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffee4,
                                                  in_stack_fffffffffffffee0)))),
                                      (char *)in_stack_fffffffffffffed8);
              if (bVar2) {
                uVar8 = std::__cxx11::string::size();
                if (((uVar8 < 3) ||
                    (pcVar9 = (char *)std::__cxx11::string::front(), *pcVar9 != '\"')) ||
                   (pcVar9 = (char *)std::__cxx11::string::back(), *pcVar9 != '\"')) {
                  ParserTarget::ErrorExitDeferred<std::__cxx11::string_const&>
                            (in_stack_fffffffffffffef0,
                             (FileLoc *)
                             CONCAT17(in_stack_fffffffffffffeef,
                                      CONCAT16(in_stack_fffffffffffffeee,
                                               CONCAT15(in_stack_fffffffffffffeed,
                                                        CONCAT14(in_stack_fffffffffffffeec,
                                                                 CONCAT13(in_stack_fffffffffffffeeb,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffeea,
                                                  CONCAT11(in_stack_fffffffffffffee9,
                                                           in_stack_fffffffffffffee8))))))),
                             (char *)CONCAT17(in_stack_fffffffffffffee7,
                                              CONCAT16(in_stack_fffffffffffffee6,
                                                       CONCAT15(in_stack_fffffffffffffee5,
                                                                CONCAT14(in_stack_fffffffffffffee4,
                                                                         in_stack_fffffffffffffee0))
                                                      )),in_stack_fffffffffffffed8);
                }
                std::__cxx11::string::size();
                std::__cxx11::string::substr((ulong)&stack0xffffffffffffff48,(ulong)local_18);
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffffee7,
                                                    CONCAT16(in_stack_fffffffffffffee6,
                                                             CONCAT15(in_stack_fffffffffffffee5,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffee4,
                                                  in_stack_fffffffffffffee0)))),
                                        (char *)in_stack_fffffffffffffed8);
                if (bVar2) {
                  Options[4] = 0;
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(in_stack_fffffffffffffee7,
                                                      CONCAT16(in_stack_fffffffffffffee6,
                                                               CONCAT15(in_stack_fffffffffffffee5,
                                                                        CONCAT14(
                                                  in_stack_fffffffffffffee4,
                                                  in_stack_fffffffffffffee0)))),
                                          (char *)in_stack_fffffffffffffed8);
                  if (bVar2) {
                    Options[4] = 1;
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_fffffffffffffee7,
                                                        CONCAT16(in_stack_fffffffffffffee6,
                                                                 CONCAT15(in_stack_fffffffffffffee5,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffee4,
                                                  in_stack_fffffffffffffee0)))),
                                            (char *)in_stack_fffffffffffffed8);
                    if (!bVar2) {
                      ErrorExit<std::__cxx11::string&>
                                (in_stack_ffffffffffffff10,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(uVar1,in_stack_ffffffffffffff08));
                    }
                    Options[4] = 2;
                  }
                }
                std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
              }
              else {
                uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT17(in_stack_fffffffffffffee7,
                                                    CONCAT16(in_stack_fffffffffffffee6,
                                                             CONCAT15(in_stack_fffffffffffffee5,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffee4,
                                                  in_stack_fffffffffffffee0)))),
                                        (char *)in_stack_fffffffffffffed8);
                if ((bool)uVar1) {
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  iVar7 = atoi(pcVar9);
                  *Options = iVar7;
                }
                else {
                  uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)CONCAT17(in_stack_fffffffffffffee7,
                                                      CONCAT16(in_stack_fffffffffffffee6,
                                                               CONCAT15(in_stack_fffffffffffffee5,
                                                                        CONCAT14(
                                                  in_stack_fffffffffffffee4,
                                                  in_stack_fffffffffffffee0)))),
                                          (char *)in_stack_fffffffffffffed8);
                  if ((bool)uVar3) {
                    uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_fffffffffffffee7,
                                                        CONCAT16(in_stack_fffffffffffffee6,
                                                                 CONCAT15(in_stack_fffffffffffffee5,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffee4,
                                                  in_stack_fffffffffffffee0)))),
                                            (char *)in_stack_fffffffffffffed8);
                    if ((bool)uVar4) {
                      *(undefined1 *)((long)Options + 9) = 1;
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT17(in_stack_fffffffffffffee7,
                                                          CONCAT16(in_stack_fffffffffffffee6,
                                                                   CONCAT15(
                                                  in_stack_fffffffffffffee5,
                                                  CONCAT14(in_stack_fffffffffffffee4,
                                                           in_stack_fffffffffffffee0)))),
                                              (char *)in_stack_fffffffffffffed8);
                      if (bVar2) {
                        *(undefined1 *)((long)Options + 9) = 0;
                      }
                      else {
                        ParserTarget::ErrorExitDeferred<std::__cxx11::string_const&>
                                  (in_stack_fffffffffffffef0,
                                   (FileLoc *)
                                   CONCAT17(in_stack_fffffffffffffeef,
                                            CONCAT16(in_stack_fffffffffffffeee,
                                                     CONCAT15(in_stack_fffffffffffffeed,
                                                              CONCAT14(uVar1,CONCAT13(uVar3,CONCAT12
                                                  (uVar4,CONCAT11(bVar2,in_stack_fffffffffffffee8)))
                                                  )))),
                                   (char *)CONCAT17(in_stack_fffffffffffffee7,
                                                    CONCAT16(in_stack_fffffffffffffee6,
                                                             CONCAT15(in_stack_fffffffffffffee5,
                                                                      CONCAT14(
                                                  in_stack_fffffffffffffee4,
                                                  in_stack_fffffffffffffee0)))),
                                   in_stack_fffffffffffffed8);
                      }
                    }
                  }
                  else {
                    uVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT17(in_stack_fffffffffffffee7,
                                                        CONCAT16(in_stack_fffffffffffffee6,
                                                                 CONCAT15(in_stack_fffffffffffffee5,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffee4,
                                                  in_stack_fffffffffffffee0)))),
                                            (char *)in_stack_fffffffffffffed8);
                    if ((bool)uVar4) {
                      uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT17(in_stack_fffffffffffffee7,
                                                          CONCAT16(in_stack_fffffffffffffee6,
                                                                   CONCAT15(
                                                  in_stack_fffffffffffffee5,
                                                  CONCAT14(in_stack_fffffffffffffee4,
                                                           in_stack_fffffffffffffee0)))),
                                              (char *)in_stack_fffffffffffffed8);
                      if ((bool)uVar5) {
                        *(undefined1 *)((long)Options + 0x42) = 1;
                      }
                      else {
                        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffee6
                                                                           ,CONCAT15(
                                                  in_stack_fffffffffffffee5,
                                                  CONCAT14(in_stack_fffffffffffffee4,
                                                           in_stack_fffffffffffffee0)))),
                                                (char *)in_stack_fffffffffffffed8);
                        if (bVar2) {
                          *(undefined1 *)((long)Options + 0x42) = 0;
                        }
                        else {
                          ParserTarget::ErrorExitDeferred<std::__cxx11::string_const&>
                                    (in_stack_fffffffffffffef0,
                                     (FileLoc *)
                                     CONCAT17(in_stack_fffffffffffffeef,
                                              CONCAT16(in_stack_fffffffffffffeee,
                                                       CONCAT15(in_stack_fffffffffffffeed,
                                                                CONCAT14(uVar1,CONCAT13(uVar3,
                                                  CONCAT12(in_stack_fffffffffffffeea,
                                                           CONCAT11(in_stack_fffffffffffffee9,uVar4)
                                                          )))))),
                                     (char *)CONCAT17(uVar5,CONCAT16(bVar2,CONCAT15(
                                                  in_stack_fffffffffffffee5,
                                                  CONCAT14(in_stack_fffffffffffffee4,
                                                           in_stack_fffffffffffffee0)))),
                                     in_stack_fffffffffffffed8);
                        }
                      }
                    }
                    else {
                      uVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)CONCAT17(in_stack_fffffffffffffee7,
                                                          CONCAT16(in_stack_fffffffffffffee6,
                                                                   CONCAT15(
                                                  in_stack_fffffffffffffee5,
                                                  CONCAT14(in_stack_fffffffffffffee4,
                                                           in_stack_fffffffffffffee0)))),
                                              (char *)in_stack_fffffffffffffed8);
                      if ((bool)uVar5) {
                        uVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)CONCAT17(in_stack_fffffffffffffee7,
                                                            CONCAT16(in_stack_fffffffffffffee6,
                                                                     CONCAT15(uVar5,CONCAT14(
                                                  in_stack_fffffffffffffee4,
                                                  in_stack_fffffffffffffee0)))),
                                                (char *)in_stack_fffffffffffffed8);
                        if ((bool)uVar6) {
                          *(undefined1 *)((long)Options + 0xb) = 1;
                        }
                        else {
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)CONCAT17(in_stack_fffffffffffffee7,
                                                             CONCAT16(in_stack_fffffffffffffee6,
                                                                      CONCAT15(uVar5,CONCAT14(uVar6,
                                                  in_stack_fffffffffffffee0)))),
                                                  (char *)in_stack_fffffffffffffed8);
                          if (bVar2) {
                            *(undefined1 *)((long)Options + 0xb) = 0;
                          }
                          else {
                            ParserTarget::ErrorExitDeferred<std::__cxx11::string_const&>
                                      (in_stack_fffffffffffffef0,
                                       (FileLoc *)
                                       CONCAT17(in_stack_fffffffffffffeef,
                                                CONCAT16(in_stack_fffffffffffffeee,
                                                         CONCAT15(in_stack_fffffffffffffeed,
                                                                  CONCAT14(uVar1,CONCAT13(uVar3,
                                                  CONCAT12(in_stack_fffffffffffffeea,
                                                           CONCAT11(in_stack_fffffffffffffee9,uVar4)
                                                          )))))),
                                       (char *)CONCAT17(in_stack_fffffffffffffee7,
                                                        CONCAT16(in_stack_fffffffffffffee6,
                                                                 CONCAT15(uVar5,CONCAT14(uVar6,
                                                  CONCAT13(bVar2,(int3)in_stack_fffffffffffffee0))))
                                                  ),in_stack_fffffffffffffed8);
                          }
                        }
                      }
                      else {
                        ParserTarget::ErrorExitDeferred<std::__cxx11::string_const&>
                                  (in_stack_fffffffffffffef0,
                                   (FileLoc *)
                                   CONCAT17(in_stack_fffffffffffffeef,
                                            CONCAT16(in_stack_fffffffffffffeee,
                                                     CONCAT15(in_stack_fffffffffffffeed,
                                                              CONCAT14(uVar1,CONCAT13(uVar3,CONCAT12
                                                  (in_stack_fffffffffffffeea,
                                                   CONCAT11(in_stack_fffffffffffffee9,uVar4))))))),
                                   (char *)CONCAT17(in_stack_fffffffffffffee7,
                                                    CONCAT16(in_stack_fffffffffffffee6,
                                                             CONCAT15(uVar5,CONCAT14(
                                                  in_stack_fffffffffffffee4,
                                                  in_stack_fffffffffffffee0)))),
                                   in_stack_fffffffffffffed8);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void BasicSceneBuilder::Option(const std::string &name, const std::string &value,
                               FileLoc loc) {
    std::string nName = normalizeArg(name);

    if (nName == "disablepixeljitter") {
        if (value == "true")
            Options->disablePixelJitter = true;
        else if (value == "false")
            Options->disablePixelJitter = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else if (nName == "disabletexturefiltering") {
        if (value == "true")
            Options->disableTextureFiltering = true;
        else if (value == "false")
            Options->disableTextureFiltering = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else if (nName == "disablewavelengthjitter") {
        if (value == "true")
            Options->disableWavelengthJitter = true;
        else if (value == "false")
            Options->disableWavelengthJitter = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else if (nName == "displacementedgescale") {
        if (!Atof(value, &Options->displacementEdgeScale))
            ErrorExitDeferred(&loc, "%s: expected floating-point option value", value);
    } else if (nName == "msereferenceimage") {
        if (value.size() < 3 || value.front() != '"' || value.back() != '"')
            ErrorExitDeferred(&loc, "%s: expected quoted string for option value", value);
        Options->mseReferenceImage = value.substr(1, value.size() - 2);
    } else if (nName == "msereferenceout") {
        if (value.size() < 3 || value.front() != '"' || value.back() != '"')
            ErrorExitDeferred(&loc, "%s: expected quoted string for option value", value);
        Options->mseReferenceOutput = value.substr(1, value.size() - 2);
    } else if (nName == "rendercoordsys") {
        if (value.size() < 3 || value.front() != '"' || value.back() != '"')
            ErrorExitDeferred(&loc, "%s: expected quoted string for option value", value);
        std::string renderCoordSys = value.substr(1, value.size() - 2);
        if (renderCoordSys == "camera")
            Options->renderingSpace = RenderingCoordinateSystem::Camera;
        else if (renderCoordSys == "cameraworld")
            Options->renderingSpace = RenderingCoordinateSystem::CameraWorld;
        else if (renderCoordSys == "world")
            Options->renderingSpace = RenderingCoordinateSystem::World;
        else
            ErrorExit("%s: unknown rendering coordinate system.", renderCoordSys);
    } else if (nName == "seed") {
        Options->seed = std::atoi(value.c_str());
    } else if (nName == "forcediffuse") {
        if (value == "true")
            Options->forceDiffuse = true;
        else if (value == "false")
            Options->forceDiffuse = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else if (nName == "pixelstats") {
        if (value == "true")
            Options->recordPixelStatistics = true;
        else if (value == "false")
            Options->recordPixelStatistics = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else if (nName == "wavefront") {
        if (value == "true")
            Options->wavefront = true;
        else if (value == "false")
            Options->wavefront = false;
        else
            ErrorExitDeferred(&loc, "%s: expected \"true\" or \"false\" for option value",
                              value);
    } else
        ErrorExitDeferred(&loc, "%s: unknown option", name);

#ifdef PBRT_BUILD_GPU_RENDERER
    CopyOptionsToGPU();
#endif  // PBRT_BUILD_GPU_RENDERER
}